

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command_conflict *commands,
               size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  long lVar11;
  uint32_t uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint16_t *puVar23;
  bool bVar24;
  ulong uVar6;
  
  uVar5 = (nodes->u).next;
  if (uVar5 == 0xffffffff) {
    lVar18 = 0;
  }
  else {
    sVar2 = params->stream_offset;
    uVar8 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
    puVar23 = &commands->dist_prefix_;
    lVar11 = 0;
    lVar18 = 0;
    do {
      uVar6 = (ulong)uVar5;
      uVar21 = nodes[lVar18 + uVar6].length;
      uVar22 = nodes[lVar18 + uVar6].dcode_insert_length;
      uVar16 = (ulong)(uVar22 & 0x7ffffff);
      uVar5 = nodes[lVar18 + uVar6].u.next;
      bVar24 = lVar11 == 0;
      lVar11 = lVar11 + -1;
      uVar14 = uVar16;
      if (bVar24) {
        uVar14 = *last_insert_len + uVar16;
        *last_insert_len = 0;
      }
      uVar10 = uVar21 & 0x1ffffff;
      uVar1 = nodes[lVar18 + uVar6].distance;
      iVar19 = uVar10 - (uVar21 >> 0x19);
      uVar20 = iVar19 + 9;
      uVar6 = block_start + sVar2 + lVar18 + uVar16;
      if (uVar8 <= uVar6) {
        uVar6 = uVar8;
      }
      uVar3 = (uVar22 >> 0x1b) - 1;
      if (uVar22 < 0x8000000) {
        uVar3 = uVar1 + 0xf;
      }
      ((Command_conflict *)(puVar23 + -7))->insert_len_ = (uint32_t)uVar14;
      *(uint *)(puVar23 + -5) = (uVar20 - uVar21) * 0x2000000 | uVar10;
      uVar13 = (ulong)(params->dist).num_direct_distance_codes;
      uVar17 = uVar13 + 0x10;
      if (uVar3 < uVar17) {
        *puVar23 = (ushort)uVar3;
        uVar12 = 0;
      }
      else {
        uVar12 = (params->dist).distance_postfix_bits;
        bVar7 = (byte)uVar12;
        uVar13 = ((4L << (bVar7 & 0x3f)) + (uVar3 - uVar13)) - 0x10;
        uVar21 = 0x1f;
        if ((uint)uVar13 != 0) {
          for (; (uint)uVar13 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar21 = (uVar21 ^ 0xffffffe0) + 0x1f;
        bVar24 = (uVar13 >> ((ulong)uVar21 & 0x3f) & 1) != 0;
        iVar15 = uVar21 - uVar12;
        *puVar23 = (short)(bVar24 + 0xfffe + iVar15 * 2 << (bVar7 & 0x3f)) +
                   (short)uVar17 + (~(ushort)(-1 << (bVar7 & 0x1f)) & (ushort)uVar13) |
                   (short)iVar15 * 0x400;
        uVar12 = (uint32_t)(uVar13 - ((ulong)bVar24 + 2 << ((byte)uVar21 & 0x3f)) >> (bVar7 & 0x3f))
        ;
      }
      *(uint32_t *)(puVar23 + -3) = uVar12;
      if (uVar14 < 6) {
        uVar17 = uVar14 & 0xffffffff;
      }
      else if (uVar14 < 0x82) {
        uVar21 = 0x1f;
        uVar22 = (uint)(uVar14 - 2);
        if (uVar22 != 0) {
          for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar17 = (ulong)((int)(uVar14 - 2 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar21 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar14 < 0x842) {
        uVar22 = (uint32_t)uVar14 - 0x42;
        uVar21 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar17 = (ulong)((uVar21 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar17 = 0x15;
        if (0x1841 < uVar14) {
          uVar17 = (ulong)(ushort)(0x17 - (uVar14 < 0x5842));
        }
      }
      if (uVar20 < 10) {
        uVar21 = iVar19 + 7;
      }
      else if (uVar20 < 0x86) {
        uVar22 = iVar19 + 3;
        uVar21 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar21 = (int)((ulong)(long)(int)uVar22 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar21 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar21 = 0x17;
        if (uVar20 < 0x846) {
          uVar21 = 0x1f;
          if (iVar19 - 0x3dU != 0) {
            for (; iVar19 - 0x3dU >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          uVar21 = (uVar21 ^ 0xffe0) + 0x2c;
        }
      }
      uVar4 = (ushort)uVar21;
      uVar9 = (uVar4 & 7) + ((ushort)uVar17 & 7) * 8;
      if ((((*puVar23 & 0x3ff) == 0) && ((ushort)uVar17 < 8)) && (uVar4 < 0x10)) {
        if (7 < uVar4) {
          uVar9 = uVar9 + 0x40;
        }
      }
      else {
        iVar19 = (int)((uVar17 & 0xffff) >> 3) * 3 + ((uVar21 & 0xffff) >> 3);
        uVar9 = uVar9 + ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar19 * 0x40 + 0x40;
      }
      puVar23[-1] = uVar9;
      if ((uVar1 <= uVar6) && (uVar3 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar14;
      lVar18 = lVar18 + uVar16 + (ulong)uVar10;
      puVar23 = puVar23 + 8;
    } while (uVar5 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar18);
  return;
}

Assistant:

void BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = 0;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}